

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedUsageOperators::Run(AdvancedUsageOperators *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  int data [4];
  string local_68;
  string local_48;
  
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,2)
  ;
  lVar5 = 0x10;
  if (bVar1) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "\nlayout(std430, binding = 0) buffer Buffer0 {\n  readonly int g_i0;\n  int g_o0;\n};\nlayout(std430, binding = 1) buffer Buffer1 {\n  int i0;\n} g_buffer1;\nuniform int g_values[] = int[](1, 2, 3, 4, 5, 6);\nvoid main() {\n  g_o0 += g_i0;\n  g_o0 <<= 1;\n  g_o0 = g_i0 > g_o0 ? g_i0 : g_o0;\n  g_o0 *= g_i0;\n  g_o0 = --g_o0 + g_values[g_i0];\n  g_o0++;\n  ++g_o0;\n  g_buffer1.i0 = 0xff2f;\n  g_o0 &= g_buffer1.i0;\n}"
               ,"");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,0x1b3c1e9);
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_68,&local_48);
    this->m_program = GVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar5 = -1;
    if (bVar1) {
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_storage_buffer);
      local_68._M_dataplus._M_p = (pointer)0x500000003;
      local_68._M_string_length = 0;
      uVar4 = 0;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_68,0x88ea);
      local_68._M_dataplus._M_p = local_68._M_dataplus._M_p & 0xffffffff00000000;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,4,&local_68,0x88ea);
      glu::CallLogWrapper::glEnable(this_00,0x8c89);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x10,&local_68);
      piVar3 = &DAT_01a949e8;
      do {
        if (*(int *)((long)&local_68._M_dataplus._M_p + uVar4 * 4) != *piVar3) {
          anon_unknown_0::Output
                    ("[Buffer0] Data at index %d is %d should be %d.\n",uVar4 & 0xffffffff);
          return -1;
        }
        uVar4 = uVar4 + 1;
        piVar3 = piVar3 + 1;
      } while (uVar4 == 1);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,&local_68);
      bVar1 = true;
      do {
        if (!bVar1) {
          return -(ulong)bVar1;
        }
        bVar1 = false;
      } while ((int)local_68._M_dataplus._M_p == 0xff2f);
      anon_unknown_0::Output
                ("[Buffer1] Data at index %d is %d should be %d.\n",0,
                 (ulong)local_68._M_dataplus._M_p & 0xffffffff,0xff2f);
      lVar5 = -1;
    }
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(2))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(std430, binding = 0) buffer Buffer0 {" NL "  readonly int g_i0;" NL "  int g_o0;" NL "};" NL
			   "layout(std430, binding = 1) buffer Buffer1 {" NL "  int i0;" NL "} g_buffer1;" NL
			   "uniform int g_values[] = int[](1, 2, 3, 4, 5, 6);" NL "void main() {" NL "  g_o0 += g_i0;" NL
			   "  g_o0 <<= 1;" NL "  g_o0 = g_i0 > g_o0 ? g_i0 : g_o0;" NL "  g_o0 *= g_i0;" NL
			   "  g_o0 = --g_o0 + g_values[g_i0];" NL "  g_o0++;" NL "  ++g_o0;" NL "  g_buffer1.i0 = 0xff2f;" NL
			   "  g_o0 &= g_buffer1.i0;" NL "}";

		m_program = CreateProgram(glsl_vs, "");
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenVertexArrays(1, &m_vertex_array);
		glGenBuffers(2, m_storage_buffer);

		/* Buffer0 */
		{
			int data[4] = { 3, 5 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer1 */
		{
			int data[1] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* Buffer0 */
		{
			const int ref_data[2] = { 3, 37 };
			int		  data[4];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer0] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
		}
		/* Buffer0 */
		{
			const int ref_data[1] = { 0xff2f };
			int		  data[1];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (int i = 0; i < 1; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer1] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
		}

		return NO_ERROR;
	}